

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

int ReadFile(string *path,string *contents,string *err)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  stat st;
  char buf [65536];
  stat sStack_100c8;
  undefined1 auStack_10038 [65544];
  
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    pcVar1 = (char *)err->_M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar5);
    iVar2 = -*piVar4;
  }
  else {
    iVar2 = fileno(__stream);
    iVar2 = fstat(iVar2,&sStack_100c8);
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      pcVar1 = (char *)err->_M_string_length;
      strlen(pcVar5);
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar5);
      fclose(__stream);
      iVar2 = -*piVar4;
    }
    else {
      std::__cxx11::string::reserve((ulong)contents);
      iVar2 = feof(__stream);
      if (iVar2 == 0) {
        do {
          sVar3 = fread(auStack_10038,1,0x10000,__stream);
          if (sVar3 == 0) break;
          std::__cxx11::string::append((char *)contents,(ulong)auStack_10038);
          iVar2 = feof(__stream);
        } while (iVar2 == 0);
      }
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        fclose(__stream);
        iVar2 = 0;
      }
      else {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        pcVar1 = (char *)err->_M_string_length;
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar5);
        contents->_M_string_length = 0;
        *(contents->_M_dataplus)._M_p = '\0';
        fclose(__stream);
        iVar2 = -*piVar4;
      }
    }
  }
  return iVar2;
}

Assistant:

int ReadFile(const string& path, string* contents, string* err) {
#ifdef _WIN32
  // This makes a ninja run on a set of 1500 manifest files about 4% faster
  // than using the generic fopen code below.
  err->clear();
  HANDLE f = ::CreateFileA(path.c_str(), GENERIC_READ, FILE_SHARE_READ, NULL,
                           OPEN_EXISTING, FILE_FLAG_SEQUENTIAL_SCAN, NULL);
  if (f == INVALID_HANDLE_VALUE) {
    err->assign(GetLastErrorString());
    return -ENOENT;
  }

  for (;;) {
    DWORD len;
    char buf[64 << 10];
    if (!::ReadFile(f, buf, sizeof(buf), &len, NULL)) {
      err->assign(GetLastErrorString());
      contents->clear();
      ::CloseHandle(f);
      return -EIO;
    }
    if (len == 0)
      break;
    contents->append(buf, len);
  }
  ::CloseHandle(f);
  return 0;
#else
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    err->assign(strerror(errno));
    return -errno;
  }

  struct stat st;
  if (fstat(fileno(f), &st) < 0) {
    err->assign(strerror(errno));
    fclose(f);
    return -errno;
  }

  // +1 is for the resize in ManifestParser::Load
  contents->reserve(st.st_size + 1);

  char buf[64 << 10];
  size_t len;
  while (!feof(f) && (len = fread(buf, 1, sizeof(buf), f)) > 0) {
    contents->append(buf, len);
  }
  if (ferror(f)) {
    err->assign(strerror(errno));  // XXX errno?
    contents->clear();
    fclose(f);
    return -errno;
  }
  fclose(f);
  return 0;
#endif
}